

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.h
# Opt level: O1

mat<4UL,_4UL> * __thiscall
mat<4UL,_4UL>::invert_transpose(mat<4UL,_4UL> *__return_storage_ptr__,mat<4UL,_4UL> *this)

{
  double *pdVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  double ret_1;
  double dVar6;
  vec<4UL,_double> ret_2;
  mat<4UL,_4UL> ret;
  double local_b8 [5];
  mat<4UL,_4UL> local_90;
  
  adjugate(&local_90,this);
  dVar6 = 0.0;
  lVar2 = 3;
  do {
    dVar6 = dVar6 + local_90.rows[0].data[lVar2] * this->rows[0].data[lVar2];
    bVar5 = lVar2 != 0;
    lVar2 = lVar2 + -1;
  } while (bVar5);
  __return_storage_ptr__->rows[3].data[2] = 0.0;
  __return_storage_ptr__->rows[3].data[3] = 0.0;
  __return_storage_ptr__->rows[3].data[0] = 0.0;
  __return_storage_ptr__->rows[3].data[1] = 0.0;
  __return_storage_ptr__->rows[2].data[2] = 0.0;
  __return_storage_ptr__->rows[2].data[3] = 0.0;
  __return_storage_ptr__->rows[2].data[0] = 0.0;
  __return_storage_ptr__->rows[2].data[1] = 0.0;
  __return_storage_ptr__->rows[1].data[2] = 0.0;
  __return_storage_ptr__->rows[1].data[3] = 0.0;
  __return_storage_ptr__->rows[1].data[0] = 0.0;
  __return_storage_ptr__->rows[1].data[1] = 0.0;
  __return_storage_ptr__->rows[0].data[2] = 0.0;
  __return_storage_ptr__->rows[0].data[3] = 0.0;
  __return_storage_ptr__->rows[0].data[0] = 0.0;
  __return_storage_ptr__->rows[0].data[1] = 0.0;
  lVar2 = 4;
  do {
    lVar3 = lVar2 + -1;
    local_b8[2] = local_90.rows[lVar2 + -1].data[2];
    local_b8[3] = local_b8[lVar2 * 4 + 4];
    local_b8[0] = local_90.rows[lVar2 + -1].data[0];
    local_b8[1] = local_b8[lVar2 * 4 + 2];
    lVar4 = 3;
    do {
      local_b8[lVar4] = local_b8[lVar4] / dVar6;
      bVar5 = lVar4 != 0;
      lVar4 = lVar4 + -1;
    } while (bVar5);
    pdVar1 = __return_storage_ptr__->rows[lVar2 + -1].data + 2;
    *pdVar1 = local_b8[2];
    pdVar1[1] = local_b8[3];
    __return_storage_ptr__->rows[lVar2 + -1].data[0] = local_b8[0];
    __return_storage_ptr__->rows[lVar2 + -1].data[1] = local_b8[1];
    lVar2 = lVar3;
  } while (lVar3 != 0);
  return __return_storage_ptr__;
}

Assistant:

mat<nrows, ncols> invert_transpose() const
    {
        mat<nrows, ncols> ret = adjugate();
        return ret / dot(ret[0], rows[0]);
    }